

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCount.cpp
# Opt level: O1

int countChildElements(DOMNode *n,bool printOutEncounteredEles)

{
  char cVar1;
  int iVar2;
  wchar16 *pwVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  char *pcVar8;
  DOMNode *n_00;
  uint uVar9;
  undefined7 in_register_00000031;
  char *name_1;
  char *name;
  char *local_58;
  undefined4 local_4c;
  DOMNode *local_48;
  char *local_40;
  long local_38;
  
  if (n == (DOMNode *)0x0) {
    uVar9 = 0;
  }
  else {
    iVar2 = (**(code **)(*(long *)n + 0x20))();
    if (iVar2 == 1 && printOutEncounteredEles) {
      pwVar3 = (wchar16 *)(**(code **)(*(long *)n + 0x10))(n);
      local_40 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"----------------------------------------------------------",
                 0x3a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Encountered Element : ",0x16);
      pcVar8 = local_40;
      local_4c = (undefined4)CONCAT71(in_register_00000031,printOutEncounteredEles);
      if (local_40 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
      }
      else {
        sVar4 = strlen(local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      xercesc_4_0::XMLString::release(&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_48 = n;
      cVar1 = (**(code **)(*(long *)n + 0xd0))(n);
      if (cVar1 != '\0') {
        plVar5 = (long *)(**(code **)(*(long *)local_48 + 0x58))();
        lVar6 = (**(code **)(*plVar5 + 0x28))(plVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tAttributes",0xb)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t----------",0xb)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        local_38 = lVar6;
        if (lVar6 != 0) {
          lVar6 = 0;
          do {
            plVar7 = (long *)(**(code **)(*plVar5 + 0x18))(plVar5,lVar6);
            pwVar3 = (wchar16 *)(**(code **)(*plVar7 + 0x140))(plVar7);
            local_58 = (char *)xercesc_4_0::XMLString::transcode
                                         (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            pcVar8 = local_58;
            if (local_58 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
            }
            else {
              sVar4 = strlen(local_58);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=",1);
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            pwVar3 = (wchar16 *)(**(code **)(*plVar7 + 0x150))(plVar7);
            pcVar8 = (char *)xercesc_4_0::XMLString::transcode
                                       (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            local_58 = pcVar8;
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107078);
            }
            else {
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            lVar6 = lVar6 + 1;
          } while (local_38 != lVar6);
        }
      }
      uVar9 = 1;
      printOutEncounteredEles = SUB41(local_4c,0);
      n = local_48;
    }
    else {
      uVar9 = (uint)(iVar2 == 1);
    }
    for (n_00 = (DOMNode *)(**(code **)(*(long *)n + 0x38))(n); n_00 != (DOMNode *)0x0;
        n_00 = (DOMNode *)(**(code **)(*(long *)n_00 + 0x50))(n_00)) {
      iVar2 = countChildElements(n_00,printOutEncounteredEles);
      uVar9 = uVar9 + iVar2;
    }
  }
  return uVar9;
}

Assistant:

static int countChildElements(DOMNode *n, bool printOutEncounteredEles)
{
    DOMNode *child;
    int count = 0;
    if (n) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE)
		{
            if(printOutEncounteredEles) {
                char *name = XMLString::transcode(n->getNodeName());
                std::cout <<"----------------------------------------------------------"<<std::endl;
                std::cout <<"Encountered Element : "<< name << std::endl;

                XMLString::release(&name);

                if(n->hasAttributes()) {
                    // get all the attributes of the node
                    DOMNamedNodeMap *pAttributes = n->getAttributes();
                    const XMLSize_t nSize = pAttributes->getLength();
                    std::cout <<"\tAttributes" << std::endl;
                    std::cout <<"\t----------" << std::endl;
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        // get attribute name
                        char *name = XMLString::transcode(pAttributeNode->getName());

                        std::cout << "\t" << name << "=";
                        XMLString::release(&name);

                        // get attribute type
                        name = XMLString::transcode(pAttributeNode->getValue());
                        std::cout << name << std::endl;
                        XMLString::release(&name);
                    }
                }
            }
			++count;
		}
        for (child = n->getFirstChild(); child != 0; child=child->getNextSibling())
            count += countChildElements(child, printOutEncounteredEles);
    }
    return count;
}